

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O3

int CVmObjFileName::s_getp_fromUniversal(vm_val_t *retval,uint *oargc)

{
  int iVar1;
  vm_obj_id_t vVar2;
  ushort *puVar3;
  long lVar4;
  
  if (oargc == (uint *)0x0) {
    lVar4 = 0;
  }
  else {
    lVar4 = (long)(int)*oargc;
  }
  if (s_getp_fromUniversal(vm_val_t*,unsigned_int*)::desc == '\0') {
    s_getp_fromUniversal();
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,oargc,&s_getp_fromUniversal::desc);
  if (iVar1 == 0) {
    puVar3 = (ushort *)vm_val_t::get_as_string(sp_ + -1);
    if (puVar3 == (ushort *)0x0) {
      err_throw(0x902);
    }
    vVar2 = create_from_url((char *)(puVar3 + 1),(ulong)*puVar3);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar2;
    sp_ = sp_ + -lVar4;
  }
  return 1;
}

Assistant:

int CVmObjFileName::s_getp_fromUniversal(VMG_ vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the filename argument as a string */
    const char *str = G_stk->get(0)->get_as_string(vmg0_);
    if (str == 0)
        err_throw(VMERR_BAD_VAL_BIF);

    /* create and return the new FileName from the url syntax */
    retval->set_obj(create_from_url(vmg_ str + VMB_LEN, vmb_get_len(str)));

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}